

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  bool bVar1;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  Fault local_58;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  Schema *pSStack_18;
  DebugExpression<bool> _kjCondition;
  Schema *this_local;
  
  pSStack_18 = this;
  getProto((Reader *)&f,this);
  local_1a = capnp::schema::Node::Reader::isInterface((Reader *)&f);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (bVar1) {
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_98,this);
    local_68 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_98);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51],capnp::Text::Reader>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,299,FAILED,"getProto().isInterface()",
               "_kjCondition,\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
               ,&local_19,(char (*) [51])"Tried to use non-interface schema as an interface.",
               (Reader *)&local_68);
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return (InterfaceSchema)(Schema)this_local;
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}